

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
 __thiscall ninx::parser::Parser::parse_function_call(Parser *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Token *pTVar4;
  Keyword *this_00;
  string *psVar5;
  ParserException *pPVar6;
  string *in_RSI;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  string local_88;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  arguments;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_38;
  
  psVar5 = in_RSI + 1;
  local_a0._8_8_ = in_RSI;
  pTVar4 = TokenReader::get_token((TokenReader *)psVar5);
  if (pTVar4 == (Token *)0x0) {
    this_00 = (Keyword *)0x0;
  }
  else {
    this_00 = (Keyword *)
              __dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,&lexer::token::Keyword::typeinfo,
                             0);
  }
  arguments.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = TokenReader::check_limiter((TokenReader *)psVar5,'(');
  if (iVar1 == 1) {
    TokenReader::get_token((TokenReader *)psVar5);
    do {
      iVar1 = TokenReader::check_limiter((TokenReader *)psVar5,')');
      if (iVar1 != 0) break;
      parse_function_call_argument((Parser *)local_a0);
      std::
      vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
      ::
      emplace_back<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>
                ((vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>
                  *)&arguments,
                 (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                  *)local_a0);
      iVar2 = TokenReader::check_limiter((TokenReader *)psVar5,',');
      if (iVar2 == 1) {
        TokenReader::get_token((TokenReader *)psVar5);
      }
      else {
        iVar3 = TokenReader::check_limiter((TokenReader *)psVar5,')');
        if (iVar3 != 1) {
          pTVar4 = TokenReader::get_token((TokenReader *)psVar5);
          pPVar6 = (ParserException *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string
                    ((string *)(local_90 + 8),"Another argument or end of arguments expected.",
                     (allocator *)local_90);
          exception::ParserException::ParserException
                    (pPVar6,pTVar4,(string *)local_a0._8_8_,(string *)(local_90 + 8));
          __cxa_throw(pPVar6,&exception::ParserException::typeinfo,
                      std::runtime_error::~runtime_error);
        }
      }
      if ((long *)CONCAT71(local_a0._1_7_,local_a0[0]) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_a0._1_7_,local_a0[0]) + 8))();
      }
    } while (iVar2 == 1);
    TokenReader::get_token((TokenReader *)psVar5);
    if (iVar1 == -1) {
      pPVar6 = (ParserException *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)(local_90 + 8),"Expected \')\' but EOF has been reached.",
                 (allocator *)local_a0);
      exception::ParserException::ParserException
                (pPVar6,(Token *)0x0,(string *)local_a0._8_8_,(string *)(local_90 + 8));
      __cxa_throw(pPVar6,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  iVar1 = TokenReader::check_limiter((TokenReader *)psVar5,'{');
  if (iVar1 == 1) {
    parse_block((Parser *)local_a0);
    local_38._M_head_impl = (Block *)0x0;
    std::
    make_unique<ninx::parser::element::FunctionCallArgument,decltype(nullptr),std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
              ((void **)local_90,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&local_38);
    local_88._M_dataplus._M_p = (pointer)local_90;
    if ((long *)CONCAT71(local_a0._1_7_,local_a0[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a0._1_7_,local_a0[0]) + 8))();
    }
  }
  psVar5 = lexer::token::Keyword::get_keyword_abi_cxx11_(this_00);
  local_a0[0] = (allocator)lexer::token::Keyword::is_late(this_00);
  std::
  make_unique<ninx::parser::element::FunctionCall,std::__cxx11::string_const&,std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>>>,std::unique_ptr<ninx::parser::element::FunctionCallArgument,std::default_delete<ninx::parser::element::FunctionCallArgument>>,bool>
            (&this->origin,
             (vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
              *)psVar5,
             (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
              *)&arguments,(bool *)(local_90 + 8));
  if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
  }
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::~vector(&arguments);
  return (__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCall> ninx::parser::Parser::parse_function_call() {
    auto token{reader.get_token()};
    auto call_token{dynamic_cast<ninx::lexer::token::Keyword *>(token)};

    std::vector<std::unique_ptr<FunctionCallArgument>> arguments;

    // Parse optional call parameters
    if (reader.check_limiter('(') == 1) {
        reader.get_token();

        // Cycle until a closing parenthesis is found or EOF is reached
        int result;
        while ((result = reader.check_limiter(')')) == 0) {
            auto argument{parse_function_call_argument()};

            arguments.push_back(std::move(argument));

            if (reader.check_limiter(',') == 1) {
                // Skip the period limiter
                reader.get_token();
            } else if (reader.check_limiter(')') == 1) {
                break;
            } else {
                auto error_token{reader.get_token()};
                throw ParserException(error_token, this->origin, "Another argument or end of arguments expected.");
            }
        }
        reader.get_token(); // Skip the closing parenthesis
        if (result == -1) {
            throw ParserException(nullptr, this->origin, "Expected ')' but EOF has been reached.");
        }
    }

    std::unique_ptr<FunctionCallArgument> outer_argument{nullptr};

    // Check if there is a block argument at the end
    if (reader.check_limiter('{') == 1) {
        auto value{parse_block()};

        outer_argument = std::make_unique<FunctionCallArgument>(nullptr, std::move(value));
    }

    auto function_call = std::make_unique<FunctionCall>(call_token->get_keyword(), std::move(arguments),
                                                        std::move(outer_argument), call_token->is_late());

    return function_call;
}